

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxyd.c
# Opt level: O3

int main(int argc,char **argv)

{
  byte bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  __pid_t _Var7;
  int iVar8;
  size_t sVar9;
  int *piVar10;
  size_t sVar11;
  char *pcVar12;
  uint uVar13;
  undefined8 uVar14;
  char *unaff_R12;
  char *pcVar15;
  bool bVar16;
  sigaction sigact;
  char *local_e8;
  sigaction local_c8;
  
  memset(&local_c8,0,0x98);
  ph.priv = (void *)0x0;
  ph.conf.bind_addr = (char *)0x0;
  ph.conf.bind_addr_ext = (char *)0x0;
  ph.conf.bind_addr_ext_add = (char **)0x0;
  ph.conf.calls_allowed = (char *)0x0;
  ph.conf.calls_denied = (char *)0x0;
  ph.conf.password = (char *)0x0;
  ph.conf.reg_name = (char *)0x0;
  ph.conf.reg_comment = (char *)0x0;
  ph.conf.public_addr = (char *)0x0;
  ph.conf.connection_timeout = 0;
  ph.conf.bind_addr_ext_add_len = 0;
  ph.conf.port = 0;
  if (argc < 2) {
    bVar3 = false;
    bVar5 = false;
    bVar4 = false;
    bVar2 = false;
    local_e8 = (char *)0x0;
LAB_00101655:
    iVar8 = access("ELProxy.conf",4);
    pcVar15 = "../etc/ELProxy.conf";
    if (iVar8 == 0) {
      pcVar15 = "ELProxy.conf";
    }
  }
  else {
    iVar8 = 1;
    local_e8 = (char *)0x0;
    bVar2 = false;
    pcVar15 = (char *)0x0;
    bVar4 = false;
    bVar5 = false;
    bVar3 = false;
    do {
      pcVar12 = argv[iVar8];
      sVar9 = strlen(pcVar12);
      if (sVar9 < 2) {
        if (sVar9 != 0) goto LAB_0010153a;
LAB_00101b6c:
        main_cold_6();
        iVar8 = proxy_log(&ph,3,"Caught signal\n");
        uVar13 = (uint)pcVar12;
        if (uVar13 != 0xf) {
          if (uVar13 == 10) goto LAB_00101bb6;
          if (uVar13 != 2) {
            return iVar8;
          }
        }
        sentinel = 1;
        if ((0xf < uVar13) || (iVar8 = 0x8404, (0x8404U >> (uVar13 & 0x1f) & 1) == 0)) {
          return iVar8;
        }
LAB_00101bb6:
        iVar8 = proxy_shutdown(&ph);
        return iVar8;
      }
      if (*pcVar12 == '-') {
        if (pcVar12[1] == '-') {
          unaff_R12 = pcVar12 + 2;
          iVar6 = strcmp(unaff_R12,"debug");
          if (iVar6 != 0) {
            iVar6 = strcmp(unaff_R12,"help");
            if (iVar6 != 0) {
              iVar6 = strcmp(unaff_R12,"quiet");
              bVar3 = true;
              if (iVar6 == 0) goto LAB_00101546;
              goto LAB_00101b59;
            }
LAB_00101b34:
            print_usage();
            goto LAB_00101b39;
          }
          bVar2 = true;
        }
        else {
          sVar11 = 1;
          do {
            bVar1 = argv[iVar8][sVar11];
            if (bVar1 < 0x56) {
              if (bVar1 == 0x46) {
                bVar4 = true;
              }
              else if (bVar1 == 0x4c) {
                if (bVar5) {
LAB_00101b45:
                  main_cold_3();
                  goto LAB_00101b4a;
                }
                if (sVar11 + 1 < sVar9) {
                  local_e8 = argv[iVar8] + sVar11 + 1;
                  bVar5 = false;
                  sVar11 = sVar9;
                }
                else {
                  iVar8 = iVar8 + 1;
                  if (argc <= iVar8) goto LAB_00101b54;
                  local_e8 = argv[iVar8];
                  bVar5 = false;
                }
              }
              else {
                if (bVar1 != 0x53) goto LAB_00101b4a;
                if (local_e8 != (char *)0x0) {
                  main_cold_2();
                  goto LAB_00101b45;
                }
                bVar5 = true;
                local_e8 = (char *)0x0;
              }
            }
            else if (bVar1 < 0x68) {
              bVar2 = true;
              if (bVar1 != 100) {
                if (bVar1 == 0x56) goto LAB_00101b21;
LAB_00101b4a:
                main_cold_5();
                goto LAB_00101b4f;
              }
            }
            else {
              if (bVar1 != 0x71) {
                if (bVar1 != 0x68) goto LAB_00101b4a;
                goto LAB_00101b34;
              }
              bVar3 = true;
            }
            sVar11 = sVar11 + 1;
          } while (sVar11 < sVar9);
        }
      }
      else {
LAB_0010153a:
        bVar16 = pcVar15 != (char *)0x0;
        pcVar15 = pcVar12;
        if (bVar16) {
LAB_00101b4f:
          main_cold_1();
LAB_00101b54:
          main_cold_4();
LAB_00101b59:
          iVar8 = strcmp(unaff_R12,"version");
          if (iVar8 != 0) goto LAB_00101b6c;
LAB_00101b21:
          puts("0.9.4-dev");
          goto LAB_00101b39;
        }
      }
LAB_00101546:
      iVar8 = iVar8 + 1;
    } while (iVar8 < argc);
    if (pcVar15 == (char *)0x0) goto LAB_00101655;
  }
  local_c8.__sigaction_handler.sa_handler = graceful_shutdown;
  local_c8.sa_flags = 4;
  sigaction(2,&local_c8,(sigaction *)0x0);
  sigaction(0xf,&local_c8,(sigaction *)0x0);
  sigaction(10,&local_c8,(sigaction *)0x0);
  iVar8 = proxy_init(&ph);
  if (iVar8 < 0) {
    main_cold_8();
    goto LAB_00101ac9;
  }
  iVar8 = 2;
  if (!bVar3) {
    iVar8 = 4 - (uint)!bVar2;
  }
  proxy_log_level(&ph,iVar8);
  iVar8 = proxy_log_select_medium(&ph,1,0);
  if (iVar8 < 0) {
    main_cold_7();
    goto LAB_00101ac9;
  }
  iVar8 = proxy_load_conf(&ph,pcVar15);
  if (iVar8 < 0) {
    pcVar12 = strerror(-iVar8);
    proxy_log(&ph,0,"Failed to load config from \'%s\' (%d): %s\n",pcVar15,-iVar8,pcVar12);
    goto LAB_00101ac9;
  }
  iVar8 = proxy_open();
  if (iVar8 < 0) {
    iVar6 = -iVar8;
    pcVar15 = strerror(iVar6);
    pcVar12 = "Failed to open proxy (%d): %s\n";
LAB_00101a53:
    proxy_log(&ph,0,pcVar12,iVar6,pcVar15);
  }
  else {
    if (bVar4) {
      if (local_e8 == (char *)0x0) {
        if (bVar5) {
          proxy_log(&ph,3,"Switching log to syslog\n");
          iVar8 = proxy_log_select_medium(&ph,3,0);
          if (iVar8 != 0) {
            iVar8 = -iVar8;
            pcVar15 = strerror(iVar8);
            pcVar12 = "Failed to activate syslog (%d): %s\n";
            goto LAB_001018a8;
          }
        }
      }
      else {
        proxy_log(&ph,3,"Switching log to file \"%s\"\n");
        iVar8 = proxy_log_select_medium(&ph,2,local_e8);
        if (iVar8 != 0) {
          iVar8 = -iVar8;
          pcVar15 = strerror(iVar8);
          pcVar12 = "Failed to open log file (%d): %s\n";
LAB_001018a8:
          proxy_log(&ph,1,pcVar12,iVar8,pcVar15);
        }
      }
LAB_0010198e:
      iVar8 = proxy_start(&ph);
      if (iVar8 < 0) {
        iVar6 = -iVar8;
        pcVar15 = strerror(iVar6);
        pcVar12 = "Failed to start proxy (%d): %s\n";
        goto LAB_00101a53;
      }
      proxy_log(&ph,3,"Ready.\n");
      if ((iVar8 == 0) && ((sentinel & 1) == 0)) {
        do {
          proxy_log(&ph,4,"Starting a processing run...\n");
          iVar8 = proxy_process(&ph);
          if (iVar8 < 0) {
            if (iVar8 != -4) {
              pcVar15 = strerror(-iVar8);
              proxy_log(&ph,0,"Message processing failure (%d): %s\n",-iVar8,pcVar15);
              break;
            }
            iVar8 = 0;
            while (sentinel == 0) {
              usleep(50000);
            }
          }
          if ((iVar8 != 0) || ((sentinel & 1) != 0)) break;
        } while( true );
      }
      pcVar15 = "Shutting down...\n";
      uVar14 = 3;
    }
    else {
      iVar8 = fork();
      if (-1 < iVar8) {
        if (iVar8 != 0) {
LAB_00101b39:
          exit(0);
        }
        if (local_e8 == (char *)0x0) {
          if (bVar5) {
            iVar8 = proxy_log_select_medium(&ph,3,0);
            if (iVar8 != 0) {
              pcVar15 = "Failed to activate syslog (%d): %s\n";
              goto LAB_00101918;
            }
            goto LAB_0010193c;
          }
        }
        else {
          iVar8 = proxy_log_select_medium(&ph,2);
          if (iVar8 != 0) {
            pcVar15 = "Failed to open log file (%d): %s\n";
LAB_00101918:
            pcVar12 = strerror(-iVar8);
            proxy_log(&ph,1,pcVar15,-iVar8,pcVar12);
          }
LAB_0010193c:
          proxy_log_level(&ph,4 - (uint)!bVar2);
        }
        umask(0);
        _Var7 = setsid();
        if (_Var7 < 0) {
          piVar10 = __errno_location();
          iVar8 = *piVar10;
          pcVar15 = strerror(iVar8);
          pcVar12 = "Process error (%d): %s\n";
        }
        else {
          iVar8 = chdir("/");
          if (-1 < iVar8) {
            close(0);
            close(1);
            close(2);
            goto LAB_0010198e;
          }
          piVar10 = __errno_location();
          iVar8 = *piVar10;
          pcVar15 = strerror(iVar8);
          pcVar12 = "Failed to change dir (%d): %s\n";
        }
        proxy_log(&ph,0,pcVar12,iVar8,pcVar15);
        iVar8 = *piVar10;
        goto LAB_00101ac9;
      }
      pcVar15 = "Error forking daemon process\n";
      uVar14 = 0;
    }
    proxy_log(&ph,uVar14,pcVar15);
  }
LAB_00101ac9:
  proxy_free(&ph);
  return iVar8;
}

Assistant:

int main(int argc, const char * const argv[])
{
	struct proxy_opts opts;

#ifndef _WIN32
	struct sigaction sigact;
#endif
	int ret;

	memset(&opts, 0x0, sizeof(opts));
#ifndef _WIN32
	memset(&sigact, 0x0, sizeof(sigact));
#endif
	memset(&ph, 0x0, sizeof(ph));

	parse_args(argc, argv, &opts);
	if (opts.config_path == NULL) {
#ifdef OPENELP_CONFIG_HINT
		opts.config_path = proxy_config_hint();
#else
		opts.config_path = config_path_default;
#endif
	}

#ifndef _WIN32
	/* Handle SIGINT/SIGTERM */
	sigact.sa_sigaction = graceful_shutdown;
	sigact.sa_flags |= SA_SIGINFO;

	sigaction(SIGINT, &sigact, NULL);
	sigaction(SIGTERM, &sigact, NULL);
	sigaction(SIGUSR1, &sigact, NULL);
#else
	if (!SetConsoleCtrlHandler(graceful_shutdown, TRUE))
		fprintf(stderr, "Failed to set signal handler (%d)\n",
			GetLastError());

#endif

	/* Initialize proxy */
	ret = proxy_init(&ph);
	if (ret < 0) {
		fprintf(stderr, "Failed to initialize proxy (%d): %s\n", -ret,
			strerror(-ret));
		goto proxyd_exit;
	}

	/* Set the initial logging level */
	proxy_log_level(&ph, opts.quiet ? LOG_LEVEL_WARN : opts.debug ?
			LOG_LEVEL_DEBUG : LOG_LEVEL_INFO);

	/* Open the log */
	ret = proxy_log_select_medium(&ph, LOG_MEDIUM_STDOUT, NULL);
	if (ret < 0) {
		fprintf(stderr, "Failed to switch log to STDOUT (%d): %s\n",
			-ret, strerror(-ret));
		goto proxyd_exit;
	}

	/* Load the config */
	ret = proxy_load_conf(&ph, opts.config_path);
	if (ret < 0) {
		proxy_log(&ph, LOG_LEVEL_FATAL,
			  "Failed to load config from '%s' (%d): %s\n",
			  opts.config_path, -ret, strerror(-ret));
		goto proxyd_exit;
	}

	/* Start listening */
	ret = proxy_open(&ph);
	if (ret < 0) {
		proxy_log(&ph, LOG_LEVEL_FATAL,
			  "Failed to open proxy (%d): %s\n",
			  -ret, strerror(-ret));
		goto proxyd_exit;
	}

#ifndef _WIN32
	/* Daemonize */
	if (!opts.foreground) {
		pid_t pid;
		pid_t sid;

		pid = fork();

		if (pid < 0) {
			proxy_log(&ph, LOG_LEVEL_FATAL,
				  "Error forking daemon process\n");
			ret = pid;
			goto proxyd_exit;
		}

		if (pid > 0)
			exit(0);

		/*! @TODO Double-fork */

		if (opts.log_path) {
			ret = proxy_log_select_medium(&ph, LOG_MEDIUM_FILE,
						      opts.log_path);
			if (ret != 0)
				proxy_log(&ph, LOG_LEVEL_ERROR,
					  "Failed to open log file (%d): %s\n",
					  -ret, strerror(-ret));
			proxy_log_level(&ph, opts.debug ? LOG_LEVEL_DEBUG :
					LOG_LEVEL_INFO);
		} else if (opts.syslog) {
			ret = proxy_log_select_medium(&ph, LOG_MEDIUM_SYSLOG,
						      opts.log_path);
			if (ret != 0)
				proxy_log(&ph, LOG_LEVEL_ERROR,
					  "Failed to activate syslog (%d): %s\n",
					  -ret, strerror(-ret));
			proxy_log_level(&ph, opts.debug ? LOG_LEVEL_DEBUG :
					LOG_LEVEL_INFO);
		}

		umask(0);

		sid = setsid();
		if (sid < 0) {
			proxy_log(&ph, LOG_LEVEL_FATAL,
				  "Process error (%d): %s\n",
				  errno, strerror(errno));
			ret = errno;
			goto proxyd_exit;
		}

		if (chdir("/") < 0) {
			proxy_log(&ph, LOG_LEVEL_FATAL,
				  "Failed to change dir (%d): %s\n",
				  errno, strerror(errno));
			ret = errno;
			goto proxyd_exit;
		}

		close(STDIN_FILENO);
		close(STDOUT_FILENO);
		close(STDERR_FILENO);
	} else
#endif
	{
		/* Switch log, if necessary */
		if (opts.log_path) {
			proxy_log(&ph, LOG_LEVEL_INFO,
				  "Switching log to file \"%s\"\n",
				  opts.log_path);

			ret = proxy_log_select_medium(&ph, LOG_MEDIUM_FILE,
						      opts.log_path);
			if (ret != 0)
				proxy_log(&ph, LOG_LEVEL_ERROR,
					  "Failed to open log file (%d): %s\n",
					  -ret, strerror(-ret));
		} else if (opts.syslog) {
			proxy_log(&ph, LOG_LEVEL_INFO,
				  "Switching log to syslog\n");

			ret = proxy_log_select_medium(&ph, LOG_MEDIUM_SYSLOG,
						      opts.log_path);
			if (ret != 0)
				proxy_log(&ph, LOG_LEVEL_ERROR,
					  "Failed to activate syslog (%d): %s\n",
					  -ret, strerror(-ret));
		} else if (opts.eventlog) {
			proxy_log(&ph, LOG_LEVEL_INFO,
				  "Switching log to eventlog\n");

			ret = proxy_log_select_medium(&ph, LOG_MEDIUM_EVENTLOG,
						      opts.log_path);
			if (ret != 0)
				proxy_log(&ph, LOG_LEVEL_ERROR,
					  "Failed to activate eventlog (%d): %s\n",
					  -ret, strerror(-ret));
		}
	}

	ret = proxy_start(&ph);
	if (ret < 0) {
		proxy_log(&ph, LOG_LEVEL_FATAL,
			  "Failed to start proxy (%d): %s\n",
			  -ret, strerror(-ret));
		goto proxyd_exit;
	}

	proxy_log(&ph, LOG_LEVEL_INFO, "Ready.\n");

	/* Main dispatch loop */
	while (ret == 0 && sentinel == 0) {
		proxy_log(&ph, LOG_LEVEL_DEBUG,
			  "Starting a processing run...\n");
		ret = proxy_process(&ph);
		if (ret < 0) {
			switch (ret) {
			case -EINTR:
				ret = 0;

				/*! @TODO Something better than a busy loop */
				while (!sentinel) {
#ifdef _WIN32
					Sleep(50);
#else
					usleep(50000);
#endif
				}

				break;
			default:
				proxy_log(&ph, LOG_LEVEL_FATAL,
					  "Message processing failure (%d): %s\n",
					  -ret, strerror(-ret));
				break;
			}
		}
	}

	proxy_log(&ph, LOG_LEVEL_INFO, "Shutting down...\n");

proxyd_exit:
	proxy_free(&ph);

#ifdef _WIN32
	if (ret != 0) {
		HWND console_window = GetConsoleWindow();

		if (console_window != NULL) {
			DWORD process_id;

			GetWindowThreadProcessId(console_window, &process_id);
			if (GetCurrentProcessId() == process_id) {
				printf("Press any key to exit . . . ");
				_getch();
			}
		}
	}
#endif

	return ret;
}